

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastBS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ParseContext *ctx_00;
  ushort *puVar2;
  ulong hasbits_00;
  ulong uVar3;
  char *pcVar4;
  uint *puVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *ctx_01;
  TcParseTableBase *pTVar6;
  ArenaStringPtr *field;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar4 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  pTVar6 = table;
  field = (ArenaStringPtr *)hasbits;
  ctx_00 = (ParseContext *)
           RefAt<google::protobuf::internal::ArenaStringPtr>(msg,(ulong)data.field_0 >> 0x30);
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  if ((Arena *)arena.data == (Arena *)0x0) {
    puVar2 = (ushort *)
             anon_unknown_105::ReadStringNoArena
                       ((MessageLite *)(ptr + 1),(char *)ctx,ctx_00,0,pTVar6,field);
  }
  else {
    puVar2 = (ushort *)
             EpsCopyInputStream::ReadArenaString
                       (&ctx->super_EpsCopyInputStream,ptr + 1,(ArenaStringPtr *)ctx_00,
                        (Arena *)arena);
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if (puVar2 == (ushort *)0x0) {
    anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)ctx_00);
    pcVar4 = Error(msg,(char *)ctx_00,ctx_01,(TcFieldData)arena,table,hasbits_00);
    return pcVar4;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar2) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar5 = *puVar5 | (uint)hasbits_00;
    }
    return (char *)puVar2;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar2;
  if ((uVar1 & 7) == 0) {
    uVar3 = (ulong)(uVar1 & 0xfffffff8);
    pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + uVar3))
                               (msg,puVar2,ctx,
                                (ulong)*puVar2 ^ *(ulong *)(&table[1].fast_idx_mask + uVar3 * 2),
                                table,hasbits_00);
    return pcVar4;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, ArenaStringPtr, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}